

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Form.cpp
# Opt level: O1

void __thiscall curlpp::FormParts::File::File(File *this,char *name,char *filename)

{
  allocator local_1a;
  allocator local_19;
  
  (this->super_FormPart)._vptr_FormPart = (_func_int **)&PTR__FormPart_00133b70;
  std::__cxx11::string::string((string *)&(this->super_FormPart).mName,name,&local_19);
  (this->super_FormPart)._vptr_FormPart = (_func_int **)&PTR__File_00133ba0;
  std::__cxx11::string::string((string *)&this->mFilename,filename,&local_1a);
  (this->mContentType)._M_dataplus._M_p = (pointer)&(this->mContentType).field_2;
  (this->mContentType)._M_string_length = 0;
  (this->mContentType).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

curlpp::FormParts::File::File(const char * name, const char * filename)
  : FormPart(name)
  , mFilename(filename)
{}